

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

void __thiscall adios2::core::Engine::PerformPuts(Engine *this)

{
  string *in_stack_000000b8;
  Engine *in_stack_000000c0;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"PerformPuts",&local_29);
  ThrowUp(in_stack_000000c0,in_stack_000000b8);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return;
}

Assistant:

void Engine::PerformPuts() { ThrowUp("PerformPuts"); }